

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webrtc_vad.c
# Opt level: O0

int WebRtcVad_Process(VadInst *handle,int fs,int16_t *audio_frame,size_t frame_length)

{
  int iVar1;
  VadInstT *self;
  int vad;
  size_t frame_length_local;
  int16_t *audio_frame_local;
  int fs_local;
  VadInst *handle_local;
  
  self._4_4_ = -1;
  if (handle == (VadInst *)0x0) {
    handle_local._4_4_ = -1;
  }
  else if (*(int *)(handle + 0x2dc) == 0x2a) {
    if (audio_frame == (int16_t *)0x0) {
      handle_local._4_4_ = -1;
    }
    else {
      iVar1 = WebRtcVad_ValidRateAndFrameLength(fs,frame_length);
      if (iVar1 == 0) {
        if (fs == 48000) {
          self._4_4_ = WebRtcVad_CalcVad48khz((VadInstT *)handle,audio_frame,frame_length);
        }
        else if (fs == 32000) {
          self._4_4_ = WebRtcVad_CalcVad32khz((VadInstT *)handle,audio_frame,frame_length);
        }
        else if (fs == 16000) {
          self._4_4_ = WebRtcVad_CalcVad16khz((VadInstT *)handle,audio_frame,frame_length);
        }
        else if (fs == 8000) {
          self._4_4_ = WebRtcVad_CalcVad8khz((VadInstT *)handle,audio_frame,frame_length);
        }
        if (0 < self._4_4_) {
          self._4_4_ = 1;
        }
        handle_local._4_4_ = self._4_4_;
      }
      else {
        handle_local._4_4_ = -1;
      }
    }
  }
  else {
    handle_local._4_4_ = -1;
  }
  return handle_local._4_4_;
}

Assistant:

int WebRtcVad_Process(VadInst* handle, int fs, const int16_t* audio_frame,
                      size_t frame_length) {
  int vad = -1;
  VadInstT* self = (VadInstT*) handle;

  if (handle == NULL) {
    return -1;
  }

  if (self->init_flag != kInitCheck) {
    return -1;
  }
  if (audio_frame == NULL) {
    return -1;
  }
  if (WebRtcVad_ValidRateAndFrameLength(fs, frame_length) != 0) {
    return -1;
  }

  if (fs == 48000) {
      vad = WebRtcVad_CalcVad48khz(self, audio_frame, frame_length);
  } else if (fs == 32000) {
    vad = WebRtcVad_CalcVad32khz(self, audio_frame, frame_length);
  } else if (fs == 16000) {
    vad = WebRtcVad_CalcVad16khz(self, audio_frame, frame_length);
  } else if (fs == 8000) {
    vad = WebRtcVad_CalcVad8khz(self, audio_frame, frame_length);
  }

  if (vad > 0) {
    vad = 1;
  }
  return vad;
}